

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_add_plugin(_func_void *newplugin)

{
  size_t sVar1;
  fsnav_struct *pfVar2;
  fsnav_plugin *pfVar3;
  ulong uVar4;
  
  uVar4 = (fsnav->core).plugin_count + 1;
  if (uVar4 < 0xffffffff) {
    pfVar3 = (fsnav_plugin *)realloc((fsnav->core).plugins,uVar4 * 0x18);
    pfVar2 = fsnav;
    if (pfVar3 != (fsnav_plugin *)0x0) {
      (fsnav->core).plugins = pfVar3;
      sVar1 = (pfVar2->core).plugin_count;
      pfVar3[sVar1].func = newplugin;
      pfVar3[sVar1].cycle = 1;
      pfVar3[sVar1].shift = 0;
      pfVar3[sVar1].tick = 0;
      (pfVar2->core).plugin_count = sVar1 + 1;
      return '\x01';
    }
    fsnav_free();
  }
  return '\0';
}

Assistant:

char fsnav_add_plugin(void(*newplugin)(void))
{
	fsnav_plugin* reallocated_pointer;

	if (fsnav->core.plugin_count + 1 >= UINT_MAX)
		return 0;

	reallocated_pointer = (fsnav_plugin*)realloc((void*)(fsnav->core.plugins), (fsnav->core.plugin_count + 1)*sizeof(fsnav_plugin));

	if (reallocated_pointer == NULL) { // failed to allocate/realocate memory
		fsnav_free();
		return 0;
	} 
	else
		fsnav->core.plugins = reallocated_pointer;

	fsnav->core.plugins[fsnav->core.plugin_count].func  = newplugin;
	fsnav->core.plugins[fsnav->core.plugin_count].cycle = 1;
	fsnav->core.plugins[fsnav->core.plugin_count].shift = 0;
	fsnav->core.plugins[fsnav->core.plugin_count].tick  = 0;
	fsnav->core.plugin_count++;

	return 1;
}